

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

int socket_server_poll(socket_server *ss,socket_message *result,int *more)

{
  __fd_mask *p_Var1;
  byte bVar2;
  uint16_t uVar3;
  addrinfo *paVar4;
  void *pvVar5;
  uintptr_t uVar6;
  undefined8 uVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ssize_t sVar14;
  socket *psVar15;
  socket *psVar16;
  int *piVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  size_t __n;
  addrinfo **__pai;
  _Bool *p_Var22;
  event *peVar23;
  uint8_t *udp_address;
  bool bVar24;
  byte local_3ca;
  byte local_3c9;
  event *local_3c8;
  socket *local_3c0;
  socket_message *local_3b8;
  addrinfo *ai_list;
  char *local_3a8;
  uint8_t *local_3a0;
  sockaddr_all u;
  undefined8 local_378;
  undefined8 uStack_370;
  socklen_t len;
  _Bool *local_350;
  int *local_348;
  fd_set *local_340;
  uint8_t buffer [256];
  
  local_340 = &ss->rfds;
  local_3c0 = ss->slot;
  local_3a8 = ss->buffer;
  local_3c8 = ss->ev;
  local_3a0 = ss->udpbuffer;
  local_350 = &ss->ev[0].write;
  peVar23 = local_3c8;
  local_348 = more;
LAB_0010f519:
  while (ss->checkctrl == 0) {
LAB_0010f5d6:
    iVar10 = ss->event_index;
    if (iVar10 == ss->event_n) {
      uVar11 = epoll_wait(ss->event_fd,(epoll_event *)buffer,0x40,-1);
      uVar20 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar20 = 0;
      }
      p_Var22 = local_350;
      for (lVar21 = 0; uVar20 * 0xc - lVar21 != 0; lVar21 = lVar21 + 0xc) {
        ((event *)(p_Var22 + -9))->s = *(void **)(buffer + lVar21 + 4);
        bVar2 = buffer[lVar21];
        *p_Var22 = (_Bool)(bVar2 >> 2 & 1);
        p_Var22[-1] = (_Bool)(bVar2 & 1);
        p_Var22 = p_Var22 + 0x10;
      }
      ss->event_n = uVar11;
      ss->checkctrl = 1;
      if (local_348 != (int *)0x0) {
        *local_348 = 0;
        uVar11 = ss->event_n;
      }
      ss->event_index = 0;
      iVar10 = 0;
      if ((int)uVar11 < 1) {
        ss->event_n = 0;
        return -1;
      }
    }
    ss->event_index = iVar10 + 1;
    psVar16 = (socket *)peVar23[iVar10].s;
    if (psVar16 != (socket *)0x0) {
      uVar3 = psVar16->type;
      if (uVar3 == 3) {
        len = 0x1c;
        iVar10 = accept(psVar16->fd,(sockaddr *)&u.s,&len);
        if (iVar10 < 0) {
          piVar17 = __errno_location();
          if (*piVar17 - 0x17U < 2) {
            result->opaque = psVar16->opaque;
            result->id = psVar16->id;
            result->ud = 0;
            pcVar19 = strerror(*piVar17);
            result->data = pcVar19;
            return 4;
          }
        }
        else {
          iVar13 = reserve_id(ss);
          if (-1 < iVar13) {
            socket_keepalive(iVar10);
            sp_nonblocking(iVar10);
            psVar15 = new_fd(ss,iVar13,iVar10,0,psVar16->opaque,false);
            if (psVar15 != (socket *)0x0) {
              psVar15->type = 7;
              result->opaque = psVar16->opaque;
              result->id = psVar16->id;
              result->ud = iVar13;
              result->data = (char *)0x0;
              uVar8 = u.v4.sin_port;
              pcVar18 = inet_ntop((uint)u.s.sa_family,
                                  (void *)((long)&u + (ulong)(u.s.sa_family != 2) * 4 + 4),
                                  (char *)buffer,0x2e);
              pcVar19 = local_3a8;
              if (pcVar18 != (char *)0x0) {
                snprintf(local_3a8,0x80,"%s:%d",buffer,
                         (ulong)(ushort)(uVar8 << 8 | (ushort)uVar8 >> 8));
                result->data = pcVar19;
              }
              return 3;
            }
          }
          close(iVar10);
          peVar23 = local_3c8;
        }
      }
      else if (uVar3 == 0) {
        fwrite("socket-server: invalid socket\n",0x1e,1,_stderr);
      }
      else {
        if (uVar3 == 4) {
          len = 4;
          iVar10 = getsockopt(psVar16->fd,1,4,&u,&len);
          if ((-1 < iVar10) && (u._0_4_ == 0)) {
            psVar16->type = 5;
            result->opaque = psVar16->opaque;
            result->id = psVar16->id;
            result->ud = 0;
            if (((psVar16->high).head == (write_buffer *)0x0) &&
               ((psVar16->low).head == (write_buffer *)0x0)) {
              sp_write(ss->event_fd,psVar16->fd,psVar16,false);
            }
            ai_list = (addrinfo *)CONCAT44(ai_list._4_4_,0x1c);
            iVar10 = getpeername(psVar16->fd,(sockaddr *)buffer,(socklen_t *)&ai_list);
            pcVar19 = local_3a8;
            if ((iVar10 != 0) ||
               (pcVar18 = inet_ntop((uint)(ushort)buffer._0_2_,
                                    buffer + (ulong)((ushort)buffer._0_2_ != 2) * 4 + 4,local_3a8,
                                    0x80), pcVar18 == (char *)0x0)) {
              pcVar19 = (char *)0x0;
            }
            result->data = pcVar19;
            return 2;
          }
          force_close(ss,psVar16,result);
          piVar17 = __errno_location();
          pcVar19 = strerror(*piVar17);
          result->data = pcVar19;
          return 4;
        }
        if (peVar23[iVar10].read == true) {
          if (psVar16->protocol == 0) {
            iVar13 = (psVar16->p).size;
            local_3b8 = result;
            pcVar19 = (char *)malloc((long)iVar13);
            sVar14 = read(psVar16->fd,pcVar19,(long)iVar13);
            iVar12 = (int)sVar14;
            if (iVar12 < 0) {
              free(pcVar19);
              piVar17 = __errno_location();
              result = local_3b8;
              if (*piVar17 == 4) {
LAB_0010fb81:
                bVar24 = true;
                iVar13 = -1;
                result = local_3b8;
                goto LAB_0010fc5c;
              }
              if (*piVar17 != 0xb) goto LAB_0010fb5c;
              fwrite("socket-server: EAGAIN capture.\n",0x1f,1,_stderr);
              goto LAB_0010fb2d;
            }
            if (iVar12 == 0) {
              free(pcVar19);
              result = local_3b8;
              force_close(ss,psVar16,local_3b8);
              bVar24 = false;
              iVar13 = 1;
              goto LAB_0010fc5c;
            }
            if (psVar16->type == 6) {
              free(pcVar19);
              goto LAB_0010fb81;
            }
            if (iVar13 == iVar12) {
              iVar13 = (psVar16->p).size * 2;
LAB_0010fd3f:
              (psVar16->p).size = iVar13;
            }
            else if ((0x40 < iVar13) && (iVar12 * 2 < iVar13)) {
              iVar13 = (psVar16->p).size / 2;
              goto LAB_0010fd3f;
            }
            local_3b8->opaque = psVar16->opaque;
            local_3b8->id = psVar16->id;
            local_3b8->ud = iVar12;
            local_3b8->data = pcVar19;
            bVar24 = false;
            iVar13 = 0;
            result = local_3b8;
          }
          else {
            u._0_4_ = 0x1c;
            sVar14 = recvfrom(psVar16->fd,local_3a0,0xffff,0,(sockaddr *)buffer,(socklen_t *)&u);
            uVar11 = (uint)sVar14;
            if ((int)uVar11 < 0) {
              piVar17 = __errno_location();
              if ((*piVar17 != 4) && (*piVar17 != 0xb)) {
LAB_0010fb5c:
                force_close(ss,psVar16,result);
                pcVar19 = strerror(*piVar17);
                result->data = pcVar19;
                bVar24 = false;
                iVar13 = 4;
                goto LAB_0010fc5c;
              }
            }
            else if (u._0_4_ == 0x10) {
              if (psVar16->protocol == 1) {
                pcVar19 = (char *)malloc((ulong)(uVar11 + 7));
                __n = (size_t)(uVar11 & 0x7fffffff);
                pcVar19[__n] = '\x01';
                *(undefined2 *)(pcVar19 + __n + 1) = buffer._2_2_;
                *(uint *)(pcVar19 + __n + 3) = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4]));
LAB_001101c4:
                memcpy(pcVar19,local_3a0,__n);
                result->opaque = psVar16->opaque;
                result->id = psVar16->id;
                result->ud = uVar11;
                result->data = pcVar19;
                ss->event_index = ss->event_index + -1;
                return 6;
              }
            }
            else if (psVar16->protocol == 2) {
              pcVar19 = (char *)malloc((ulong)(uVar11 + 0x13));
              __n = (size_t)(uVar11 & 0x7fffffff);
              pcVar19[__n] = '\x02';
              *(undefined2 *)(pcVar19 + __n + 1) = buffer._2_2_;
              *(ulong *)(pcVar19 + __n + 3) =
                   CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
              *(ulong *)(pcVar19 + __n + 3 + 8) = CONCAT44(buffer._20_4_,buffer._16_4_);
              goto LAB_001101c4;
            }
LAB_0010fb2d:
            bVar24 = true;
            iVar13 = -1;
          }
LAB_0010fc5c:
          if (peVar23[iVar10].write == true) {
            if (iVar13 == 1) {
              return 1;
            }
            if (iVar13 == 4) {
              return 4;
            }
            peVar23[iVar10].read = false;
            ss->event_index = ss->event_index + -1;
          }
          peVar23 = local_3c8;
          if (!bVar24) {
            return iVar13;
          }
        }
        else if ((peVar23[iVar10].write == true) &&
                (iVar10 = send_buffer(ss,psVar16,result), iVar10 != -1)) {
          return iVar10;
        }
      }
    }
  }
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  iVar10 = ss->recvctrl_fd;
  p_Var1 = (ss->rfds).__fds_bits + iVar10 / 0x40;
  *p_Var1 = *p_Var1 | 1L << ((byte)iVar10 & 0x3f);
  iVar10 = select(iVar10 + 1,(fd_set *)local_340,(fd_set *)0x0,(fd_set *)0x0,(timeval *)buffer);
  if (iVar10 != 1) {
    ss->checkctrl = 0;
    goto LAB_0010f5d6;
  }
  iVar10 = ss->recvctrl_fd;
  block_readpipe(iVar10,&local_3ca,2);
  bVar2 = local_3ca;
  uVar20 = (ulong)local_3ca;
  block_readpipe(iVar10,(request_send *)buffer,(uint)local_3c9);
  uVar9 = buffer._7_4_;
  uVar8 = buffer._0_2_;
  uVar7 = u._0_8_;
  switch(bVar2) {
  case 0x41:
    iVar10 = 0;
    udp_address = buffer + 0x10;
    goto LAB_0010f907;
  case 0x42:
    result->id = CONCAT22(buffer._2_2_,buffer._0_2_);
    uVar6 = CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
    result->opaque = uVar6;
    result->ud = 0;
    iVar10 = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4]));
    psVar16 = new_fd(ss,CONCAT22(buffer._2_2_,buffer._0_2_),iVar10,0,uVar6,true);
    if (psVar16 == (socket *)0x0) {
      iVar10 = 4;
      pcVar19 = "reach skynet socket number limit";
    }
    else {
      sp_nonblocking(iVar10);
      psVar16->type = 8;
      iVar10 = 2;
      pcVar19 = "binding";
    }
    result->data = pcVar19;
    break;
  case 0x43:
    if ((local_3c0[(ushort)buffer._0_2_].type != 0) &&
       (psVar16 = local_3c0 + (ushort)buffer._0_2_,
       psVar16->id == CONCAT22(buffer._2_2_,buffer._0_2_))) {
      if (psVar16->protocol != (ushort)buffer[4]) {
        result->opaque = psVar16->opaque;
        result->id = CONCAT22(buffer._2_2_,buffer._0_2_);
        result->ud = 0;
        result->data = "protocol mismatch";
        goto LAB_00110232;
      }
      if (buffer[4] == '\x01') {
        *(undefined4 *)((long)&psVar16->p + 3) = buffer._7_4_;
        (psVar16->p).size = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,1));
      }
      else {
        *(uint *)((long)&psVar16->p + 0xf) = CONCAT31(buffer._20_3_,buffer[0x13]);
        (psVar16->p).size = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4]));
        *(uint *)((long)&psVar16->p + 4) = CONCAT13(buffer[0xb],buffer._8_3_);
        *(undefined4 *)((long)&psVar16->p + 8) = buffer._12_4_;
        *(undefined4 *)((long)&psVar16->p + 0xc) = buffer._16_4_;
      }
    }
    goto LAB_0010f519;
  case 0x44:
    iVar10 = 0;
    goto LAB_0010f904;
  default:
    fprintf(_stderr,"socket-server: Unknown ctrl %c.\n",uVar20);
    goto LAB_0010f519;
  case 0x4b:
    iVar13 = CONCAT22(buffer._2_2_,buffer._0_2_);
    if ((local_3c0[(ushort)buffer._0_2_].type == 0) ||
       (psVar16 = local_3c0 + (ushort)buffer._0_2_, psVar16->id != iVar13)) {
      result->id = iVar13;
      result->opaque = CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
      result->ud = 0;
      result->data = (char *)0x0;
    }
    else {
      if (((psVar16->high).head != (write_buffer *)0x0) ||
         ((psVar16->low).head != (write_buffer *)0x0)) {
        iVar10 = send_buffer(ss,psVar16,result);
        if (iVar10 != -1) break;
        if (((psVar16->high).head != (write_buffer *)0x0) ||
           ((psVar16->low).head != (write_buffer *)0x0)) {
          psVar16->type = 6;
          peVar23 = local_3c8;
          goto LAB_0010f519;
        }
      }
      force_close(ss,psVar16,result);
      result->id = iVar13;
      result->opaque = CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
    }
    iVar10 = 1;
    break;
  case 0x4c:
    iVar10 = CONCAT22(buffer._2_2_,buffer._0_2_);
    iVar13 = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4]));
    uVar6 = CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
    psVar16 = new_fd(ss,iVar10,iVar13,0,uVar6,false);
    if (psVar16 != (socket *)0x0) {
      psVar16->type = 2;
      peVar23 = local_3c8;
      goto LAB_0010f519;
    }
    close(iVar13);
    result->opaque = uVar6;
    result->id = iVar10;
    result->ud = 0;
    result->data = "reach skynet socket number limit";
    local_3c0[(ushort)uVar8].type = 0;
LAB_00110232:
    iVar10 = 4;
    break;
  case 0x4f:
    iVar10 = CONCAT22(buffer._2_2_,buffer._0_2_);
    result->opaque = CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
    result->id = iVar10;
    result->ud = 0;
    result->data = (char *)0x0;
    ai_list = (addrinfo *)0x0;
    sprintf((char *)&len,"%d",(ulong)CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4])));
    u._0_8_ = 0;
    u._16_8_ = 0;
    stack0xfffffffffffffc80 = 0;
    local_378 = 0;
    uStack_370 = 0;
    u._8_1_ = '\x01';
    u._9_1_ = '\0';
    u._10_1_ = '\0';
    u._11_1_ = '\0';
    u._12_1_ = '\x06';
    u._13_1_ = '\0';
    u._14_1_ = '\0';
    u._15_1_ = '\0';
    __pai = (addrinfo **)&ai_list;
    iVar13 = getaddrinfo((char *)(buffer + 0x10),(char *)&len,(addrinfo *)&u.s,__pai);
    if (iVar13 == 0) {
      while (paVar4 = *__pai, paVar4 != (addrinfo *)0x0) {
        iVar13 = socket(paVar4->ai_family,paVar4->ai_socktype,paVar4->ai_protocol);
        if (-1 < iVar13) {
          socket_keepalive(iVar13);
          sp_nonblocking(iVar13);
          iVar12 = connect(iVar13,paVar4->ai_addr,paVar4->ai_addrlen);
          if ((iVar12 == 0) || (piVar17 = __errno_location(), *piVar17 == 0x73)) {
            psVar16 = new_fd(ss,iVar10,iVar13,0,
                             CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_)),true);
            pcVar19 = local_3a8;
            if (psVar16 == (socket *)0x0) {
              close(iVar13);
              pcVar19 = "reach skynet socket number limit";
              peVar23 = local_3c8;
              goto LAB_0010fd7b;
            }
            if (iVar12 == 0) {
              psVar16->type = 5;
              pcVar18 = inet_ntop(paVar4->ai_family,
                                  paVar4->ai_addr->sa_data + (ulong)(paVar4->ai_family != 2) * 4 + 2
                                  ,local_3a8,0x80);
              peVar23 = local_3c8;
              if (pcVar18 != (char *)0x0) {
                result->data = pcVar19;
              }
              freeaddrinfo((addrinfo *)ai_list);
              iVar10 = 2;
            }
            else {
              psVar16->type = 4;
              sp_write(ss->event_fd,psVar16->fd,psVar16,true);
              freeaddrinfo((addrinfo *)ai_list);
              iVar10 = -1;
              peVar23 = local_3c8;
            }
            goto LAB_0010fd9f;
          }
          close(iVar13);
          peVar23 = local_3c8;
        }
        __pai = &paVar4->ai_next;
      }
      piVar17 = __errno_location();
      pcVar19 = strerror(*piVar17);
    }
    else {
      pcVar19 = gai_strerror(iVar13);
    }
LAB_0010fd7b:
    result->data = pcVar19;
    freeaddrinfo((addrinfo *)ai_list);
    local_3c0[(ushort)uVar8].type = 0;
    iVar10 = 4;
    goto LAB_0010fd9f;
  case 0x50:
    iVar10 = 1;
LAB_0010f904:
    udp_address = (uint8_t *)0x0;
LAB_0010f907:
    iVar10 = send_socket(ss,(request_send *)buffer,result,iVar10,udp_address);
LAB_0010fd9f:
    if (iVar10 == -1) goto LAB_0010f519;
    break;
  case 0x53:
    result->id = CONCAT22(buffer._2_2_,buffer._0_2_);
    uVar6 = CONCAT44(buffer._12_4_,CONCAT13(buffer[0xb],buffer._8_3_));
    result->opaque = uVar6;
    result->ud = 0;
    result->data = (char *)0x0;
    uVar3 = local_3c0[(ushort)buffer._0_2_].type;
    if ((uVar3 == 0) ||
       (psVar16 = local_3c0 + (ushort)buffer._0_2_,
       psVar16->id != CONCAT22(buffer._2_2_,buffer._0_2_))) {
      iVar10 = 4;
      pcVar19 = "invalid socket";
    }
    else {
      if (uVar3 != 7) {
        if (uVar3 == 5) {
          psVar16->opaque = uVar6;
          iVar10 = 2;
          pcVar19 = "transfer";
          goto LAB_00110149;
        }
        if (uVar3 != 2) goto LAB_0010f519;
      }
      iVar10 = sp_add(ss->event_fd,psVar16->fd,psVar16);
      if (iVar10 == 0) {
        bVar24 = psVar16->type == 7;
        psVar16->type = bVar24 + 3 + (ushort)bVar24;
        psVar16->opaque = uVar6;
        iVar10 = 2;
        pcVar19 = "start";
      }
      else {
        psVar16->type = 0;
        piVar17 = __errno_location();
        pcVar19 = strerror(*piVar17);
        iVar10 = 4;
      }
    }
LAB_00110149:
    result->data = pcVar19;
    break;
  case 0x54:
    uVar20 = (ulong)(ushort)buffer._0_2_;
    if ((local_3c0[uVar20].type != 0) &&
       (local_3c0[uVar20].id == CONCAT22(buffer._2_2_,buffer._0_2_))) {
      iVar10 = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4]));
      u.s.sa_data[1] = buffer[0xb];
      u._0_1_ = buffer[8];
      u._1_1_ = buffer[9];
      u._2_1_ = buffer[10];
      u.v6.sin6_flowinfo = SUB84(uVar7,4);
      buffer._7_4_ = uVar9;
      setsockopt(local_3c0[uVar20].fd,6,iVar10,&u,4);
    }
    goto LAB_0010f519;
  case 0x55:
    iVar10 = CONCAT13(buffer[7],CONCAT21(buffer._5_2_,buffer[4]));
    psVar16 = new_fd(ss,CONCAT22(buffer._2_2_,buffer._0_2_),iVar10,
                     (CONCAT13(buffer[0xb],buffer._8_3_) == 10) + 1,
                     CONCAT44(buffer._20_4_,buffer._16_4_),true);
    if (psVar16 == (socket *)0x0) {
      close(iVar10);
      local_3c0[(ushort)uVar8].type = 0;
    }
    else {
      psVar16->type = 5;
      *(undefined8 *)&psVar16->p = 0;
      *(undefined8 *)((long)&psVar16->p + 8) = 0;
      *(undefined4 *)((long)&psVar16->p + 0xf) = 0;
    }
    goto LAB_0010f519;
  case 0x58:
    result->opaque = 0;
    result->id = 0;
    result->ud = 0;
    result->data = (char *)0x0;
    iVar10 = 5;
  }
  if ((iVar10 != 4) && (iVar10 != 1)) {
    return iVar10;
  }
  lVar21 = (long)ss->event_index;
  peVar23 = ss->ev + lVar21;
  while( true ) {
    if (ss->event_n <= lVar21) {
      return iVar10;
    }
    pvVar5 = peVar23->s;
    if (((pvVar5 != (void *)0x0) && (*(short *)((long)pvVar5 + 0x3a) == 0)) &&
       (*(int *)((long)pvVar5 + 0x34) == result->id)) break;
    lVar21 = lVar21 + 1;
    peVar23 = peVar23 + 1;
  }
  peVar23->s = (void *)0x0;
  return iVar10;
}

Assistant:

int 
socket_server_poll(struct socket_server *ss, struct socket_message * result, int * more) {
	for (;;) {
		if (ss->checkctrl) {
			if (has_cmd(ss)) {
				int type = ctrl_cmd(ss, result);
				if (type != -1) {
					clear_closed_event(ss, result, type);
					return type;
				} else
					continue;
			} else {
				ss->checkctrl = 0;
			}
		}
		if (ss->event_index == ss->event_n) {
			ss->event_n = sp_wait(ss->event_fd, ss->ev, MAX_EVENT);
			ss->checkctrl = 1;
			if (more) {
				*more = 0;
			}
			ss->event_index = 0;
			if (ss->event_n <= 0) {
				ss->event_n = 0;
				return -1;
			}
		}
		struct event *e = &ss->ev[ss->event_index++];
		struct socket *s = e->s;
		if (s == NULL) {
			// dispatch pipe message at beginning
			continue;
		}
		switch (s->type) {
		case SOCKET_TYPE_CONNECTING:
			return report_connect(ss, s, result);
		case SOCKET_TYPE_LISTEN: {
			int ok = report_accept(ss, s, result);
			if (ok > 0) {
				return SOCKET_ACCEPT;
			} if (ok < 0 ) {
				return SOCKET_ERROR;
			}
			// when ok == 0, retry
			break;
		}
		case SOCKET_TYPE_INVALID:
			fprintf(stderr, "socket-server: invalid socket\n");
			break;
		default:
			if (e->read) {
				int type;
				if (s->protocol == PROTOCOL_TCP) {
					type = forward_message_tcp(ss, s, result);
				} else {
					type = forward_message_udp(ss, s, result);
					if (type == SOCKET_UDP) {
						// try read again
						--ss->event_index;
						return SOCKET_UDP;
					}
				}
				if (e->write && type != SOCKET_CLOSE && type != SOCKET_ERROR) {
					// Try to dispatch write message next step if write flag set.
					e->read = false;
					--ss->event_index;
				}
				if (type == -1)
					break;				
				return type;
			}
			if (e->write) {
				int type = send_buffer(ss, s, result);
				if (type == -1)
					break;
				return type;
			}
			break;
		}
	}
}